

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O1

Fad<double> * __thiscall
Fad<double>::operator=
          (Fad<double> *this,
          FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>
          *fadexpr)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *pFVar5;
  Fad<double> *pFVar6;
  Fad<double> *pFVar7;
  double *pdVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  double *pdVar12;
  double *pdVar13;
  
  pFVar5 = (fadexpr->fadexpr_).right_;
  uVar1 = (((pFVar5->fadexpr_).left_)->dx_).num_elts;
  uVar2 = (((pFVar5->fadexpr_).right_)->dx_).num_elts;
  if ((int)uVar2 < (int)uVar1) {
    uVar2 = uVar1;
  }
  uVar9 = (ulong)uVar2;
  uVar1 = (this->dx_).num_elts;
  if (uVar2 != uVar1) {
    if (uVar2 == 0) {
      if (uVar1 != 0) {
        pdVar8 = (this->dx_).ptr_to_data;
        if (pdVar8 != (double *)0x0) {
          operator_delete__(pdVar8);
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (double *)0x0;
      }
    }
    else {
      if (uVar1 != 0) {
        pdVar8 = (this->dx_).ptr_to_data;
        if (pdVar8 != (double *)0x0) {
          operator_delete__(pdVar8);
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (double *)0x0;
      }
      (this->dx_).num_elts = uVar2;
      uVar10 = 0xffffffffffffffff;
      if (-1 < (int)uVar2) {
        uVar10 = (long)(int)uVar2 << 3;
      }
      pdVar8 = (double *)operator_new__(uVar10);
      (this->dx_).ptr_to_data = pdVar8;
    }
  }
  if (uVar2 != 0) {
    pdVar8 = (this->dx_).ptr_to_data;
    pFVar5 = (fadexpr->fadexpr_).right_;
    pFVar6 = (pFVar5->fadexpr_).left_;
    iVar3 = (pFVar6->dx_).num_elts;
    if ((iVar3 == 0) || ((((pFVar5->fadexpr_).right_)->dx_).num_elts == 0)) {
      if (0 < (int)uVar2) {
        pFVar7 = (pFVar5->fadexpr_).right_;
        iVar4 = (pFVar7->dx_).num_elts;
        lVar11 = 0;
        do {
          pdVar13 = (double *)((long)(pFVar6->dx_).ptr_to_data + lVar11);
          if (iVar3 == 0) {
            pdVar13 = &pFVar6->defaultVal;
          }
          pdVar12 = (double *)((long)(pFVar7->dx_).ptr_to_data + lVar11);
          if (iVar4 == 0) {
            pdVar12 = &pFVar7->defaultVal;
          }
          *(double *)((long)pdVar8 + lVar11) =
               (*pdVar13 + *pdVar12) * (fadexpr->fadexpr_).left_.constant_;
          lVar11 = lVar11 + 8;
          uVar9 = uVar9 - 1;
        } while (uVar9 != 0);
      }
    }
    else if (0 < (int)uVar2) {
      pdVar13 = (pFVar6->dx_).ptr_to_data;
      pdVar12 = (((pFVar5->fadexpr_).right_)->dx_).ptr_to_data;
      uVar10 = 0;
      do {
        pdVar8[uVar10] = (pdVar13[uVar10] + pdVar12[uVar10]) * (fadexpr->fadexpr_).left_.constant_;
        uVar10 = uVar10 + 1;
      } while (uVar9 != uVar10);
    }
  }
  pFVar5 = (fadexpr->fadexpr_).right_;
  this->val_ = (((pFVar5->fadexpr_).left_)->val_ + ((pFVar5->fadexpr_).right_)->val_) *
               (fadexpr->fadexpr_).left_.constant_;
  return this;
}

Assistant:

inline Fad<T> & Fad<T>::operator=(const FadExpr<ExprT>& fadexpr) 
{
  int sz = fadexpr.size();

  if ( sz != dx_.size() ) dx_.resize(sz);

  if ( sz ) {
    T* RESTRICT dxp = dx_.begin();
    if (fadexpr.hasFastAccess())
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.fastAccessDx(i);
    else
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.dx(i);
  }
  
  val_ = fadexpr.val();
  
  return *this;
}